

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printRegImmShift(MCInst *MI,SStream *O,ARM_AM_ShiftOpc ShOpc,uint ShImm)

{
  uint uVar1;
  uint in_ECX;
  ARM_AM_ShiftOpc in_EDX;
  SStream *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffffd8;
  SStream *in_stack_ffffffffffffffe0;
  SStream *ss;
  
  if ((in_EDX != ARM_AM_no_shift) && ((in_EDX != ARM_AM_lsl || (in_ECX != 0)))) {
    SStream_concat0(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    ss = in_RSI;
    ARM_AM_getShiftOpcStr(in_EDX);
    SStream_concat0(ss,in_stack_ffffffffffffffd8);
    if (*(int *)(*(long *)(in_RDI + 800) + 0x60) != 0) {
      if ((*(byte *)(*(long *)(in_RDI + 800) + 0x6c) & 1) == 0) {
        *(ARM_AM_ShiftOpc *)
         (*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) +
          (long)(int)(*(byte *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x78) - 1) * 0x30 +
         0x84) = in_EDX;
      }
      else {
        *(ARM_AM_ShiftOpc *)
         (*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) +
          (ulong)*(byte *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x78) * 0x30 + 0x84) =
             in_EDX;
      }
    }
    if (in_EDX != ARM_AM_rrx) {
      SStream_concat0(ss,in_stack_ffffffffffffffd8);
      uVar1 = translateShiftImm(in_ECX);
      SStream_concat(in_RSI,"#%u",(ulong)uVar1);
      if (*(int *)(*(long *)(in_RDI + 800) + 0x60) != 0) {
        if ((*(byte *)(*(long *)(in_RDI + 800) + 0x6c) & 1) == 0) {
          uVar1 = translateShiftImm(in_ECX);
          *(uint *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) +
                    (long)(int)(*(byte *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x78) - 1) *
                    0x30 + 0x88) = uVar1;
        }
        else {
          uVar1 = translateShiftImm(in_ECX);
          *(uint *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) +
                    (ulong)*(byte *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x78) * 0x30 +
                   0x88) = uVar1;
        }
      }
    }
  }
  return;
}

Assistant:

static void printRegImmShift(MCInst *MI, SStream *O, ARM_AM_ShiftOpc ShOpc, unsigned ShImm)
{
	if (ShOpc == ARM_AM_no_shift || (ShOpc == ARM_AM_lsl && !ShImm))
		return;
	SStream_concat0(O, ", ");

	//assert (!(ShOpc == ARM_AM_ror && !ShImm) && "Cannot have ror #0");
	SStream_concat0(O, ARM_AM_getShiftOpcStr(ShOpc));
	if (MI->csh->detail) {
		if (MI->csh->doing_mem)
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.type = (arm_shifter)ShOpc;
		else
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = (arm_shifter)ShOpc;
	}

	if (ShOpc != ARM_AM_rrx) {
		SStream_concat0(O, " ");
		SStream_concat(O, "#%u", translateShiftImm(ShImm));
		if (MI->csh->detail) {
			if (MI->csh->doing_mem)
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.value = translateShiftImm(ShImm);
			else
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = translateShiftImm(ShImm);
		}
	}
}